

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

uint32_t __thiscall
slang::IntervalMapDetails::LeafNode<unsigned_long,_std::monostate,_3U,_true>::insertFrom
          (LeafNode<unsigned_long,_std::monostate,_3U,_true> *this,uint32_t i,uint32_t size,
          interval<unsigned_long> *key,monostate *value)

{
  interval<unsigned_long> *piVar1;
  interval<unsigned_long> *piVar2;
  unsigned_long uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (i == 3) {
    return 4;
  }
  if (i != size) {
    if (size == 3) {
      return 4;
    }
    if (size != i) {
      uVar4 = (ulong)size;
      do {
        uVar5 = (int)uVar4 - 1;
        piVar1 = (this->
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 ).first + uVar5;
        uVar3 = piVar1->right;
        piVar2 = (this->
                 super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                 ).first + uVar4;
        piVar2->left = piVar1->left;
        piVar2->right = uVar3;
        uVar4 = (ulong)uVar5;
      } while (i != uVar5);
    }
  }
  uVar3 = key->right;
  piVar1 = (this->
           super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>).
           first + i;
  piVar1->left = key->left;
  piVar1->right = uVar3;
  return size + 1;
}

Assistant:

uint32_t LeafNode<TKey, TValue, Capacity, _IsRoot>::insertFrom(uint32_t i, uint32_t size,
                                                               const interval<TKey>& key,
                                                               const TValue& value) {
    SLANG_ASSERT(i <= size && size <= Capacity);
    SLANG_ASSERT(key.left <= key.right);
    SLANG_ASSERT(i == 0 || keyAt(i - 1).left < key.left);
    SLANG_ASSERT(i == size || !(keyAt(i).left < key.left));

    // If we're at capacity we can't insert another element.
    if (i == Capacity)
        return Capacity + 1;

    if (i != size) {
        // We're inserting in the middle -- make sure we have room.
        if (size == Capacity)
            return Capacity + 1;

        this->moveRight(i, i + 1, size - i);
    }

    this->first[i] = key;
    this->second[i] = value;
    return size + 1;
}